

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O2

err_t cmdCVCsCreate(octet *certs,size_t *certs_len,char *descr)

{
  err_t eVar1;
  long lVar2;
  size_t sVar3;
  char **argv;
  int argc;
  size_t size;
  
  eVar1 = cmdArgCreate(&argc,&argv,descr);
  if (eVar1 == 0) {
    sVar3 = 0;
    for (lVar2 = 0; lVar2 < argc; lVar2 = lVar2 + 1) {
      size = cmdFileSize(argv[lVar2]);
      if (size == 0xffffffffffffffff) {
        eVar1 = 0xcf;
LAB_00103705:
        cmdArgClose(argv);
        return eVar1;
      }
      if ((certs != (octet *)0x0) &&
         ((eVar1 = 0x6e, *certs_len < size + sVar3 ||
          (eVar1 = cmdFileReadAll(certs + sVar3,&size,argv[lVar2]), eVar1 != 0))))
      goto LAB_00103705;
      sVar3 = sVar3 + size;
    }
    cmdArgClose(argv);
    *certs_len = sVar3;
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

err_t cmdCVCsCreate(octet* certs, size_t* certs_len, const char* descr)
{
	err_t code;
	int argc;
	char** argv;
	int pos;
	size_t len;
	// pre
	ASSERT(memIsValid(certs_len, O_PER_S));
	ASSERT(memIsNullOrValid(certs, *certs_len));
	ASSERT(strIsValid(descr));
	// создать список файлов сертификатов
	code = cmdArgCreate(&argc, &argv, descr);
	ERR_CALL_CHECK(code);
	// просмотреть список
	len = 0;
	for (pos = 0; pos < argc; ++pos)
	{
		size_t size;
		// определить размер файла
		size = cmdFileSize(argv[pos]);
		code = size != SIZE_MAX ? ERR_OK : ERR_FILE_READ;
		ERR_CALL_HANDLE(code, cmdArgClose(argv));
		// режим чтения?
		if (certs)
		{
			// выход за границы?
			code = len + size <= *certs_len ? ERR_OK : ERR_OUTOFMEMORY;
			ERR_CALL_HANDLE(code, cmdArgClose(argv));
			// читать сертификат
			code = cmdFileReadAll(certs + len, &size, argv[pos]);
			ERR_CALL_HANDLE(code, cmdArgClose(argv));
		}
		// увеличить длину коллекции
		len += size;
	}
	cmdArgClose(argv);
	// завершить
	*certs_len = len;
	return code;
}